

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7193f5::
DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
::RundrPredTest(DrPredTest<unsigned_char,_void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
                *this,int speed)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  uint p_angle;
  uint uVar7;
  uint uVar8;
  
  if ((this->params_).tst_fn !=
      (_func_void_uchar_ptr_long_int_int_uchar_ptr_uchar_ptr_int_int_int_int_int *)0x0) {
    uVar3 = this->start_angle_;
    if (speed != 0) {
      uVar3 = 0;
    }
    uVar7 = 3;
    if (speed == 0) {
      uVar7 = this->stop_angle_;
    }
    this->enable_upsample_ = 0;
    iVar2 = 0;
    do {
      piVar6 = &DAT_00c1bdbc + (int)uVar3;
      uVar8 = uVar3;
      if ((int)uVar3 < (int)uVar7) {
        do {
          p_angle = uVar8;
          if (speed != 0) {
            p_angle = this->start_angle_ + *piVar6;
          }
          if (p_angle - 1 < 0x59) {
            iVar2 = (int)dr_intra_derivative[p_angle];
            this->dx_ = iVar2;
            iVar5 = 1;
          }
          else {
            if (p_angle - 0x5b < 0x59) {
              iVar2 = (int)dr_intra_derivative[0xb4 - p_angle];
              this->dx_ = iVar2;
              uVar4 = p_angle - 0x5a;
            }
            else {
              this->dx_ = 1;
              iVar2 = 1;
              iVar5 = 1;
              if (0x58 < p_angle - 0xb5) goto LAB_004acde6;
              uVar4 = 0x10e - p_angle;
            }
            iVar5 = (int)dr_intra_derivative[uVar4];
          }
LAB_004acde6:
          this->dy_ = iVar5;
          if (speed != 0) {
            printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                   (ulong)(uint)this->enable_upsample_,(ulong)p_angle);
            iVar2 = this->dx_;
            iVar5 = this->dy_;
          }
          if ((iVar2 != 0) && (iVar5 != 0)) {
            RunTest(this,speed != 0,false,p_angle);
          }
          piVar6 = piVar6 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
        iVar2 = this->enable_upsample_;
      }
      this->enable_upsample_ = iVar2 + 1;
      bVar1 = iVar2 < 1;
      iVar2 = iVar2 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void RundrPredTest(const int speed) {
    if (params_.tst_fn == nullptr) return;
    const int angles[] = { 3, 45, 87 };
    const int start_angle = speed ? 0 : start_angle_;
    const int stop_angle = speed ? 3 : stop_angle_;
    for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
      for (int i = start_angle; i < stop_angle; ++i) {
        const int angle = speed ? angles[i] + start_angle_ : i;
        dx_ = av1_get_dx(angle);
        dy_ = av1_get_dy(angle);
        if (speed) {
          printf("enable_upsample: %d angle: %d ~~~~~~~~~~~~~~~\n",
                 enable_upsample_, angle);
        }
        if (dx_ && dy_) RunTest(speed, false, angle);
      }
    }
  }